

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEFilter<int>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  char cVar1;
  uint uVar2;
  undefined4 uVar3;
  _func_int *p_Var4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  idx_t result_end;
  pointer pSVar7;
  _func_int *dataptr;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  InternalException *this;
  long lVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  idx_t iVar19;
  SelectionVector run_matches;
  SelectionVector matching_sel;
  Vector run_vector;
  SelectionVector local_118;
  undefined1 local_f8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  pSVar7 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar7 + 3));
  p_Var4 = pSVar7[3]._vptr_SegmentScanState[2];
  iVar19 = segment->offset;
  dataptr = p_Var4 + iVar19 + 8;
  uVar2 = *(uint *)&pSVar7[6]._vptr_SegmentScanState;
  if (pSVar7[7]._vptr_SegmentScanState == (_func_int **)0x0) {
    pp_Var18 = (_func_int **)((ulong)uVar2 - 8 >> 2);
    pp_Var8 = (_func_int **)operator_new__((ulong)pp_Var18);
    switchD_0105b559::default(pp_Var8,0,(size_t)pp_Var18);
    pp_Var9 = pSVar7[7]._vptr_SegmentScanState;
    pSVar7[7]._vptr_SegmentScanState = pp_Var8;
    if (pp_Var9 != (_func_int **)0x0) {
      operator_delete__(pp_Var9);
    }
    switchD_0105b559::default(pSVar7[7]._vptr_SegmentScanState,0,(size_t)pp_Var18);
    LogicalType::LogicalType(&local_b0,&result->type);
    Vector::Vector(&local_98,&local_b0,(data_ptr_t)dataptr);
    LogicalType::~LogicalType(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f8);
    Vector::ToUnifiedFormat(&local_98,(idx_t)pp_Var18,(UnifiedVectorFormat *)local_f8);
    local_118.sel_vector = (sel_t *)0x0;
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar7[8]._vptr_SegmentScanState = pp_Var18;
    ColumnSegment::FilterSelection
              (&local_118,&local_98,(UnifiedVectorFormat *)local_f8,filter,filter_state,
               (idx_t)pp_Var18,(idx_t *)(pSVar7 + 8));
    pp_Var9 = pSVar7[8]._vptr_SegmentScanState;
    if (pp_Var9 != (_func_int **)0x0) {
      pp_Var8 = pSVar7[7]._vptr_SegmentScanState;
      pp_Var18 = (_func_int **)0x0;
      do {
        pp_Var11 = pp_Var18;
        if (local_118.sel_vector != (sel_t *)0x0) {
          pp_Var11 = (_func_int **)(ulong)local_118.sel_vector[(long)pp_Var18];
        }
        *(undefined1 *)((long)pp_Var8 + (long)pp_Var11) = 1;
        pp_Var18 = (_func_int **)((long)pp_Var18 + 1);
      } while (pp_Var9 != pp_Var18);
    }
    if (local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
    if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_98 + 8));
  }
  if (pSVar7[8]._vptr_SegmentScanState == (_func_int **)0x0) {
    *sel_count = 0;
  }
  else {
    lVar10 = iVar19 + uVar2;
    pdVar5 = result->data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    SelectionVector::SelectionVector((SelectionVector *)local_f8,*sel_count);
    psVar6 = sel->sel_vector;
    uVar17 = *sel_count;
    if (psVar6 == (sel_t *)0x0) {
      uVar15 = 0;
      iVar19 = 0;
      do {
        uVar12 = uVar17 - uVar15;
        if (uVar17 < uVar15 || uVar12 == 0) break;
        pp_Var9 = pSVar7[4]._vptr_SegmentScanState;
        pp_Var8 = pSVar7[5]._vptr_SegmentScanState;
        uVar13 = (long)(ulong)*(ushort *)(p_Var4 + (long)pp_Var9 * 2 + lVar10) - (long)pp_Var8;
        uVar3 = *(undefined4 *)(dataptr + (long)pp_Var9 * 4);
        cVar1 = *(char *)((long)pSVar7[7]._vptr_SegmentScanState + (long)pp_Var9);
        if (uVar12 < uVar13) {
          uVar14 = uVar15;
          if (cVar1 != '\0') {
            do {
              *(undefined4 *)(pdVar5 + uVar14 * 4) = uVar3;
              *(sel_t *)((long)(sel_t **)local_f8._0_8_ + iVar19 * 4) = (sel_t)uVar14;
              iVar19 = iVar19 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar17 != uVar14);
          }
          pp_Var8 = (_func_int **)((long)pp_Var8 + uVar12);
        }
        else {
          if (((_func_int **)(ulong)*(ushort *)(p_Var4 + (long)pp_Var9 * 2 + lVar10) != pp_Var8) &&
             (uVar14 = uVar15, uVar16 = uVar13, cVar1 != '\0')) {
            do {
              *(undefined4 *)(pdVar5 + uVar14 * 4) = uVar3;
              *(sel_t *)((long)(sel_t **)local_f8._0_8_ + iVar19 * 4) = (sel_t)uVar14;
              iVar19 = iVar19 + 1;
              uVar16 = uVar16 - 1;
              uVar14 = uVar14 + 1;
            } while (uVar16 != 0);
          }
          uVar15 = uVar15 + uVar13;
          pSVar7[4]._vptr_SegmentScanState = (_func_int **)((long)pp_Var9 + 1);
          pp_Var8 = (_func_int **)0x0;
        }
        pSVar7[5]._vptr_SegmentScanState = pp_Var8;
      } while (uVar13 <= uVar12);
    }
    else {
      if (uVar17 == 0) {
        iVar19 = 0;
        uVar17 = 0;
      }
      else {
        pp_Var9 = pSVar7[7]._vptr_SegmentScanState;
        uVar12 = 0;
        iVar19 = 0;
        uVar15 = 0;
        do {
          uVar2 = psVar6[uVar12];
          uVar17 = (ulong)uVar2;
          uVar13 = uVar17 - uVar15;
          if (uVar17 < uVar15) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_98._0_8_ = &local_98.type.type_info_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Error in RLEFilter - selection vector indices are not ordered","");
            InternalException::InternalException(this,(string *)&local_98);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (uVar13 != 0) {
            pp_Var8 = pSVar7[4]._vptr_SegmentScanState;
            pp_Var18 = pSVar7[5]._vptr_SegmentScanState;
            do {
              uVar15 = (long)(ulong)*(ushort *)(p_Var4 + (long)pp_Var8 * 2 + lVar10) -
                       (long)pp_Var18;
              if (uVar13 < uVar15) {
                uVar15 = uVar13;
              }
              pp_Var18 = (_func_int **)((long)pp_Var18 + uVar15);
              if ((_func_int **)(ulong)*(ushort *)(p_Var4 + (long)pp_Var8 * 2 + lVar10) <= pp_Var18)
              {
                pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
                pSVar7[4]._vptr_SegmentScanState = pp_Var8;
                pp_Var18 = (_func_int **)0x0;
              }
              uVar13 = uVar13 - uVar15;
            } while (uVar13 != 0);
            pSVar7[5]._vptr_SegmentScanState = pp_Var18;
          }
          if (*(char *)((long)pp_Var9 + (long)pSVar7[4]._vptr_SegmentScanState) == '\x01') {
            *(undefined4 *)(pdVar5 + uVar17 * 4) =
                 *(undefined4 *)(dataptr + (long)pSVar7[4]._vptr_SegmentScanState * 4);
            *(uint *)((long)(sel_t **)local_f8._0_8_ + iVar19 * 4) = uVar2;
            iVar19 = iVar19 + 1;
          }
          uVar12 = uVar12 + 1;
          uVar15 = uVar17;
        } while (uVar12 < *sel_count);
      }
      uVar17 = vector_count - uVar17;
      if (uVar17 != 0) {
        pp_Var9 = pSVar7[4]._vptr_SegmentScanState;
        pp_Var8 = pSVar7[5]._vptr_SegmentScanState;
        do {
          uVar15 = (long)(ulong)*(ushort *)(p_Var4 + (long)pp_Var9 * 2 + lVar10) - (long)pp_Var8;
          if (uVar17 < uVar15) {
            uVar15 = uVar17;
          }
          pp_Var8 = (_func_int **)((long)pp_Var8 + uVar15);
          if ((_func_int **)(ulong)*(ushort *)(p_Var4 + (long)pp_Var9 * 2 + lVar10) <= pp_Var8) {
            pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
            pSVar7[4]._vptr_SegmentScanState = pp_Var9;
            pp_Var8 = (_func_int **)0x0;
          }
          uVar17 = uVar17 - uVar15;
        } while (uVar17 != 0);
        pSVar7[5]._vptr_SegmentScanState = pp_Var8;
      }
    }
    if (iVar19 != *sel_count) {
      shared_ptr<duckdb::SelectionData,_true>::operator=
                (&sel->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)(local_f8 + 8));
      sel->sel_vector = (sel_t *)local_f8._0_8_;
      *sel_count = iVar19;
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
  }
  return;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}